

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

int mock_loader_impl_clear(loader_impl impl,loader_handle handle)

{
  loader_impl_mock_handle mock_handle;
  
  if (handle != (loader_handle)0x0) {
    free(handle);
    return 0;
  }
  return 1;
}

Assistant:

int mock_loader_impl_clear(loader_impl impl, loader_handle handle)
{
	loader_impl_mock_handle mock_handle = (loader_impl_mock_handle)handle;

	(void)impl;

	if (mock_handle != NULL)
	{
		free(mock_handle);

		return 0;
	}

	return 1;
}